

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MayEmitIfNonDefaultCheck
          (anon_unknown_0 *this,Printer *p,string_view prefix,FieldDescriptor *field,
          AnyInvocable<void_()> *emit_body,bool with_enclosing_braces_always)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  FieldDescriptor *pFVar1;
  bool bVar2;
  Sub *local_420;
  Sub *local_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  undefined1 local_381;
  anon_class_8_1_4d41d52e_for_cb local_380;
  allocator<char> local_371;
  string local_370;
  Sub *local_350;
  Sub local_348;
  iterator local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_280;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  undefined1 local_251;
  anon_class_8_1_4d41d52e_for_cb local_250;
  allocator<char> local_241;
  string local_240;
  undefined1 local_220 [48];
  string local_1f0;
  Sub *local_1d0;
  Sub local_1c8;
  Sub local_110;
  iterator local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_48;
  undefined1 local_31;
  undefined8 uStack_30;
  bool with_enclosing_braces_always_local;
  AnyInvocable<void_()> *emit_body_local;
  FieldDescriptor *field_local;
  Printer *p_local;
  string_view prefix_local;
  
  emit_body_local = (AnyInvocable<void_()> *)prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  local_31 = (byte)emit_body & 1;
  uStack_30 = field;
  field_local = (FieldDescriptor *)this;
  p_local = p;
  bVar2 = ShouldEmitNonDefaultCheck((FieldDescriptor *)emit_body_local);
  pFVar1 = field_local;
  if (bVar2) {
    local_251 = '\x01';
    local_1d0 = &local_1c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"condition",(allocator<char> *)(local_220 + 0x2f));
    local_220._0_8_ = &field_local;
    local_220._8_8_ = &p_local;
    local_220._16_8_ = &emit_body_local;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::MayEmitIfNonDefaultCheck(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,absl::lts_20250127::AnyInvocable<void()>,bool)::__0>
              (&local_1c8,&local_1f0,(anon_class_24_3_dc66db61_for_cb *)local_220);
    local_1d0 = &local_110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"emit_body",&local_241);
    local_250.emit_body = (AnyInvocable<void_()> *)field;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::MayEmitIfNonDefaultCheck(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,absl::lts_20250127::AnyInvocable<void()>,bool)::__1>
              (&local_110,&local_240,&local_250);
    local_251 = '\0';
    local_58 = &local_1c8;
    local_50 = 2;
    v_00._M_len = 2;
    v_00._M_array = local_58;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_48._M_local_buf,v_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_268,
               "\n          if ($condition$) {\n            $emit_body$;\n          }\n        ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)pFVar1,local_48._M_allocated_capacity,local_48._8_8_,
                      local_268._M_len,local_268._M_str);
    local_3d0 = (Sub *)&local_58;
    do {
      local_3d0 = local_3d0 + -1;
      io::Printer::Sub::~Sub(local_3d0);
    } while (local_3d0 != &local_1c8);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)(local_220 + 0x2f));
  }
  else if ((local_31 & 1) == 0) {
    absl::lts_20250127::internal_any_invocable::Impl<void_()>::operator()((Impl<void_()> *)field);
  }
  else {
    local_381 = 1;
    local_350 = &local_348;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"emit_body",&local_371);
    local_380.emit_body = (AnyInvocable<void_()> *)field;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::MayEmitIfNonDefaultCheck(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,absl::lts_20250127::AnyInvocable<void()>,bool)::__2>
              (&local_348,&local_370,&local_380);
    local_381 = 0;
    local_290 = &local_348;
    local_288 = 1;
    v._M_len = 1;
    v._M_array = local_290;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_280._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_398,
               "\n              {\n                //~ Force newline.\n                $emit_body$;\n              }\n            "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)pFVar1,local_280._M_allocated_capacity,local_280._8_8_,
                      local_398._M_len,local_398._M_str);
    local_420 = (Sub *)&local_290;
    do {
      local_420 = local_420 + -1;
      io::Printer::Sub::~Sub(local_420);
    } while (local_420 != &local_348);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
  }
  return;
}

Assistant:

void MayEmitIfNonDefaultCheck(io::Printer* p, absl::string_view prefix,
                              const FieldDescriptor* field,
                              absl::AnyInvocable<void()> emit_body,
                              bool with_enclosing_braces_always) {
  if (ShouldEmitNonDefaultCheck(field)) {
    p->Emit(
        {
            {"condition", [&] { EmitNonDefaultCheck(p, prefix, field); }},
            {"emit_body", [&] { emit_body(); }},
        },
        R"cc(
          if ($condition$) {
            $emit_body$;
          }
        )cc");
    return;
  }

  if (with_enclosing_braces_always) {
    // In repeated fields, the same variable name may be emitted multiple
    // times, hence the need for emitting braces even when the if condition is
    // not necessary, so that the code looks like:
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    p->Emit({{"emit_body", [&] { emit_body(); }}},
            R"cc(
              {
                //~ Force newline.
                $emit_body$;
              }
            )cc");
    return;
  }

  // If no enclosing braces need to be emitted, just emit the body directly.
  emit_body();
}